

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Common.cpp
# Opt level: O3

error<idx2::idx2_err_code> idx2::Finalize(idx2_file *Idx2,params *P)

{
  buffer *Array;
  byte *pbVar1;
  v3<int> *pvVar2;
  array<idx2::subband> *Subbands;
  int iVar3;
  byte *pbVar4;
  long lVar5;
  undefined1 auVar6 [12];
  int iVar7;
  u8 uVar8;
  byte bVar9;
  int D_2;
  int iVar10;
  undefined4 uVar11;
  size_t sVar12;
  u64 uVar13;
  idx2 *this;
  char cVar14;
  byte bVar15;
  long lVar16;
  uint uVar17;
  long lVar19;
  ulong uVar20;
  uint uVar18;
  ulong uVar21;
  int D_1;
  uint uVar22;
  ulong uVar23;
  params *P_00;
  uint uVar24;
  int iVar25;
  byte bVar26;
  int iVar27;
  ulong uVar28;
  str pcVar29;
  int iVar30;
  int *piVar31;
  long lVar32;
  ulong uVar33;
  int iVar34;
  uint uVar35;
  int D;
  long lVar36;
  anon_union_8_2_2df48d06_for_stref_0 aVar37;
  undefined4 *puVar38;
  undefined8 *puVar39;
  char *pcVar40;
  anon_union_12_8_3dedac88_for_v3<int>_1 *paVar41;
  long *in_FS_OFFSET;
  bool bVar42;
  bool bVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  error<idx2::idx2_err_code> eVar49;
  v3i N3;
  v3i N3_00;
  v3i N3_01;
  char TformOrder [8];
  stack_string<64> FilesOrder;
  stack_string<64> ChunksOrderInFile;
  v3i F3;
  char BrickOrder [128];
  undefined8 local_208;
  stack_array<idx2::v3<int>,_16> *local_200;
  anon_union_8_2_2df48d06_for_stref_0 local_1f8;
  uint local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  byte local_1a8;
  anon_union_8_2_2df48d06_for_stref_0 local_198;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  allocator *paStack_188;
  undefined1 auStack_180 [16];
  allocator *paStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  byte local_158;
  anon_union_8_2_2df48d06_for_stref_0 local_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  byte local_108;
  undefined1 local_f8 [24];
  undefined1 auStack_e0 [16];
  allocator *paStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  byte local_b8;
  undefined4 *local_78;
  undefined8 *local_70;
  array<idx2::stack_string<128>_> *local_68;
  array<idx2::stack_string<128>_> *local_60;
  stack_array<idx2::v3<int>,_16> *local_58;
  stack_array<idx2::v3<int>,_16> *local_50;
  array<idx2::stack_string<128>_> *local_48;
  char *local_40;
  undefined2 local_38;
  undefined1 local_36;
  
  iVar10 = (Idx2->BrickDims3).field_0.field_0.X;
  if (((POPCOUNT(iVar10) != 1) ||
      (iVar25 = (Idx2->BrickDims3).field_0.field_0.Y, POPCOUNT(iVar25) != 1)) ||
     (iVar34 = (Idx2->BrickDims3).field_0.field_0.Z, POPCOUNT(iVar34) != 1)) {
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x16b;
    lVar16 = 0x10;
    do {
      if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar16) == '\x15') {
        cVar14 = '\x15';
        goto LAB_0016dc52;
      }
      lVar16 = lVar16 + 0x18;
    } while (lVar16 != 0x3b8);
    cVar14 = '\'';
LAB_0016dc52:
    lVar16 = 0x10;
    do {
      if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar16) == cVar14) {
        lVar19 = *in_FS_OFFSET;
        iVar10 = snprintf((char *)(lVar19 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                          (ulong)*(uint *)(&action_s::NameMap + lVar16),
                          *(undefined8 *)((long)(action_s::NameMap.Arr + 2) + lVar16),
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
                          ,0x16b);
        pcVar40 = "(%d %d %d)\n";
        snprintf((char *)(lVar19 + -0xf80) + iVar10,0x400 - (long)iVar10,"(%d %d %d)\n",
                 (ulong)(uint)(Idx2->BrickDims3).field_0.field_0.X,
                 (ulong)(uint)(Idx2->BrickDims3).field_0.field_0.Y,
                 (ulong)(uint)(Idx2->BrickDims3).field_0.field_0.Z);
        uVar35 = 0x10015;
        goto LAB_0016dd11;
      }
      lVar16 = lVar16 + 0x18;
    } while (lVar16 != 0x3b8);
    goto LAB_0016dc69;
  }
  if ((((Idx2->Dims3).field_0.field_0.X < iVar10) || ((Idx2->Dims3).field_0.field_0.Y < iVar25)) ||
     ((Idx2->Dims3).field_0.field_0.Z < iVar34)) {
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x170;
    lVar16 = 0x10;
    do {
      if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar16) == '\x16') {
        cVar14 = '\x16';
        goto LAB_0016dffb;
      }
      lVar16 = lVar16 + 0x18;
    } while (lVar16 != 0x3b8);
    cVar14 = '\'';
LAB_0016dffb:
    lVar16 = 0x10;
    do {
      if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar16) == cVar14) {
        lVar19 = *in_FS_OFFSET;
        iVar10 = snprintf((char *)(lVar19 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                          (ulong)*(uint *)(&action_s::NameMap + lVar16),
                          *(undefined8 *)((long)(action_s::NameMap.Arr + 2) + lVar16),
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
                          ,0x170);
        pcVar40 = " total dims: (%d %d %d), brick dims: (%d %d %d)\n";
        snprintf((char *)(lVar19 + -0xf80) + iVar10,0x400 - (long)iVar10,
                 " total dims: (%d %d %d), brick dims: (%d %d %d)\n",
                 (ulong)(uint)(Idx2->Dims3).field_0.field_0.X,
                 (ulong)(uint)(Idx2->Dims3).field_0.field_0.Y,
                 (ulong)(uint)(Idx2->Dims3).field_0.field_0.Z,(Idx2->BrickDims3).field_0.field_0.X,
                 (Idx2->BrickDims3).field_0.field_0.Y,(Idx2->BrickDims3).field_0.field_0.Z);
        uVar35 = 0x10016;
        goto LAB_0016dd11;
      }
      lVar16 = lVar16 + 0x18;
    } while (lVar16 != 0x3b8);
    goto LAB_0016dc69;
  }
  *(char **)(*in_FS_OFFSET + -0xb80) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
  ;
  *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x171;
  pcVar40 = "";
  uVar35 = 0;
LAB_0016dd11:
  if ((char)uVar35 != '\0') {
    uVar35 = uVar35 | 0x100;
    *(undefined4 *)(*in_FS_OFFSET + -0x97c) = 0x2d8;
    *(char **)(*in_FS_OFFSET + -0xb78) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
    ;
    goto LAB_0016dfda;
  }
  auVar44._8_8_ = 0;
  auVar44._0_8_ = P->Tolerance;
  auVar46._8_8_ = 0x7fffffffffffffff;
  auVar46._0_8_ = 0x7fffffffffffffff;
  auVar44 = vandpd_avx(auVar44,auVar46);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = Idx2->Tolerance;
  auVar44 = vmaxsd_avx(auVar47,auVar44);
  P->Tolerance = auVar44._0_8_;
  cVar14 = Idx2->NLevels;
  if (cVar14 == '\0') {
    iVar10 = (Idx2->Dims3).field_0.field_0.X;
    iVar25 = (Idx2->BrickDims3).field_0.field_0.X;
    if (iVar25 <= iVar10) {
      iVar34 = (Idx2->Dims3).field_0.field_0.Y;
      iVar27 = (Idx2->BrickDims3).field_0.field_0.Y;
      if (iVar27 <= iVar34) {
        iVar3 = (Idx2->Dims3).field_0.field_0.Z;
        iVar30 = (Idx2->BrickDims3).field_0.field_0.Z;
        cVar14 = '\0';
        do {
          if (iVar3 < iVar30) break;
          iVar7 = iVar25 * 2;
          if (iVar25 == 1) {
            iVar7 = iVar25;
          }
          iVar25 = iVar7;
          iVar7 = iVar27 * 2;
          if (iVar27 == 1) {
            iVar7 = iVar27;
          }
          iVar27 = iVar7;
          iVar7 = iVar30 * 2;
          if (iVar30 == 1) {
            iVar7 = iVar30;
          }
          iVar30 = iVar7;
          if (iVar10 < iVar25) break;
          if ((iVar27 <= iVar34) && (iVar30 <= iVar3)) {
            cVar14 = cVar14 + '\x01';
            Idx2->NLevels = cVar14;
          }
        } while (iVar27 <= iVar34);
        goto LAB_0016ddb2;
      }
    }
  }
  else {
LAB_0016ddb2:
    if ('\x10' < cVar14) {
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x2dd;
      lVar16 = 0x10;
      do {
        if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar16) == '\x17') {
          cVar14 = '\x17';
          goto LAB_0016df49;
        }
        lVar16 = lVar16 + 0x18;
      } while (lVar16 != 0x3b8);
      cVar14 = '\'';
LAB_0016df49:
      lVar16 = 0x10;
      do {
        if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar16) == cVar14) {
          lVar19 = *in_FS_OFFSET;
          iVar10 = snprintf((char *)(lVar19 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                            (ulong)*(uint *)(&action_s::NameMap + lVar16),
                            *(undefined8 *)((long)(action_s::NameMap.Arr + 2) + lVar16),
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
                            ,0x2dd);
          pcVar40 = "Max # of levels = %d\n";
          snprintf((char *)(lVar19 + -0xf80) + iVar10,0x400 - (long)iVar10,"Max # of levels = %d\n",
                   0x10);
          uVar35 = 0x10017;
          goto LAB_0016dfda;
        }
        lVar16 = lVar16 + 0x18;
      } while (lVar16 != 0x3b8);
      goto LAB_0016dc69;
    }
  }
  if ((Idx2->BitPlanesPerFile < Idx2->BitPlanesPerChunk) ||
     (Idx2->BitPlanesPerFile % Idx2->BitPlanesPerChunk != 0)) {
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x2e0;
    lVar16 = 0x10;
    do {
      if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar16) == '\x04') {
        cVar14 = '\x04';
        goto LAB_0016deb6;
      }
      lVar16 = lVar16 + 0x18;
    } while (lVar16 != 0x3b8);
    cVar14 = '\'';
LAB_0016deb6:
    lVar16 = 0x10;
    do {
      if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar16) == cVar14) {
        lVar19 = *in_FS_OFFSET;
        iVar10 = snprintf((char *)(lVar19 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                          (ulong)*(uint *)(&action_s::NameMap + lVar16),
                          *(undefined8 *)((long)(action_s::NameMap.Arr + 2) + lVar16),
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
                          ,0x2e0);
        pcVar40 = "BitPlanesPerFile not multiple of BitPlanesPerChunk\n";
        snprintf((char *)(lVar19 + -0xf80) + iVar10,0x400 - (long)iVar10,
                 "BitPlanesPerFile not multiple of BitPlanesPerChunk\n");
        uVar35 = 0x10004;
        goto LAB_0016dfda;
      }
      lVar16 = lVar16 + 0x18;
    } while (lVar16 != 0x3b8);
LAB_0016dc69:
    __assert_fail("It != End(EnumS.NameMap)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.h"
                  ,0x38,"stref idx2::ToString(idx2_err_code)");
  }
  local_208 = 0;
  iVar10 = 0;
  lVar16 = 0x27;
  do {
    if (1 < *(int *)(Idx2->Name + lVar16 * 4)) {
      lVar19 = (long)iVar10;
      iVar10 = iVar10 + 1;
      *(char *)((long)&local_208 + lVar19) = (char)lVar16 + '1';
    }
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x2a);
  *(undefined2 *)((long)&local_208 + (long)iVar10) = 0x2b2b;
  local_f8._0_8_ = &local_208;
  sVar12 = strlen((char *)&local_208);
  local_f8._8_4_ = (int)sVar12;
  uVar13 = EncodeTransformOrder((stref *)local_f8);
  Idx2->TransformOrder = uVar13;
  uVar8 = DecodeTransformOrder(uVar13,1,(Idx2->TransformOrderFull).Data);
  (Idx2->TransformOrderFull).Len = uVar8;
  iVar10 = (Idx2->BrickDims3).field_0.field_0.Z;
  auVar48._8_4_ = 1;
  auVar48._0_8_ = 0x100000001;
  auVar48._12_4_ = 1;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = (Idx2->BrickDims3).field_0.field_3.XY.field_0;
  auVar44 = vpcmpgtd_avx(auVar45,auVar48);
  auVar44 = vpsubd_avx(auVar45,auVar44);
  (Idx2->BrickDimsExt3).field_0.field_3.XY.field_0 = auVar44._0_8_;
  (Idx2->BrickDimsExt3).field_0.field_0.Z = (uint)(1 < iVar10) + iVar10;
  Subbands = &Idx2->Subbands;
  BuildSubbands(&Idx2->BrickDimsExt3,1,Idx2->TransformOrder,Subbands);
  BuildSubbands(&Idx2->BrickDims3,1,Idx2->TransformOrder,&Idx2->SubbandsNonExt);
  local_1e8 = (1L << (*(byte *)((long)&(P->DownsamplingFactor3).field_0 + 4) & 0x3f)) << 0x20 |
              1L << ((ulong)*(byte *)&(P->DownsamplingFactor3).field_0 & 0x3f);
  uStack_1e0 = CONCAT44(uStack_1e0._4_4_,
                        1 << (*(byte *)((long)&(P->DownsamplingFactor3).field_0 + 8) & 0x1f));
  if (Mallocator()::Instance == '\0') {
    Finalize();
  }
  if (Mallocator()::Instance == '\0') {
    Finalize();
  }
  local_f8._0_8_ = (anon_union_8_2_2df48d06_for_stref_0)0x0;
  local_f8._8_4_ = 0;
  local_f8._12_4_ = 0;
  local_f8._16_8_ = &Mallocator()::Instance;
  auStack_e0 = (undefined1  [16])0x0;
  paStack_d0 = (allocator *)&Mallocator()::Instance;
  if (Mallocator()::Instance == '\0') {
    Finalize();
  }
  if (Mallocator()::Instance == '\0') {
    Finalize();
  }
  local_198 = (anon_union_8_2_2df48d06_for_stref_0)0x0;
  uStack_190 = 0;
  uStack_18c = 0;
  paStack_188 = (allocator *)&Mallocator()::Instance;
  auStack_180 = (undefined1  [16])0x0;
  paStack_170 = (allocator *)&Mallocator()::Instance;
  Resize<idx2::array<idx2::v3<int>>>
            ((array<idx2::array<idx2::v3<int>_>_> *)local_f8,(long)Idx2->NLevels);
  Resize<idx2::array<idx2::v3<int>>>
            ((array<idx2::array<idx2::v3<int>_>_> *)&local_198,(long)Idx2->NLevels);
  if (Idx2->NLevels != '\0') {
    uVar20 = 0;
    do {
      lVar16 = uVar20 * 0x30;
      Resize<idx2::v3<int>>((array<idx2::v3<int>_> *)(local_198.Ptr + lVar16),(Idx2->Subbands).Size)
      ;
      Resize<idx2::v3<int>>
                ((array<idx2::v3<int>_> *)(local_f8._0_8_ + lVar16),(Idx2->Subbands).Size);
      if (uVar20 == 0x10) {
        pcVar40 = 
        "t &idx2::stack_array<idx2::array<idx2::v3<int>>, 16>::operator[](int) const [t = idx2::array<idx2::v3<int>>, N = 16]"
        ;
        goto LAB_0016f361;
      }
      Array = &(Idx2->DecodeSubbandSpacings).Arr[uVar20].Buffer;
      Resize<idx2::v3<int>>((array<idx2::v3<int>_> *)Array,(Idx2->Subbands).Size);
      if (*(long *)(local_198.Ptr + lVar16 + 0x18) == 0) {
        bVar26 = 0xff;
      }
      else {
        bVar26 = 0xff;
        lVar19 = uVar20 * 0x30;
        lVar32 = 0;
        lVar16 = 0;
        do {
          iVar27 = 1;
          iVar34 = 1;
          iVar25 = 1;
          iVar10 = 1;
          if (uVar20 != 0) {
            piVar31 = *(int **)(local_198.Ptr + lVar19 + -0x30);
            iVar10 = *piVar31;
            iVar25 = piVar31[1];
            iVar34 = piVar31[2];
          }
          lVar36 = *(long *)((Subbands->Buffer).Data + lVar16 * 0x40);
          iVar34 = (int)(lVar36 * 2 >> 0x2b) * iVar34;
          local_148._4_4_ = (int)((lVar36 << 0x16) >> 0x2b) * iVar25;
          local_148._0_4_ = (int)((lVar36 << 0x2b) >> 0x2b) * iVar10;
          lVar36 = *(long *)(local_f8._0_8_ + lVar19);
          *(anon_union_8_2_2df48d06_for_stref_0 *)(lVar36 + lVar16 * 0xc) = local_148;
          *(int *)(lVar36 + 8 + lVar16 * 0xc) = iVar34;
          uStack_140 = CONCAT44(uStack_140._4_4_,iVar34);
          iVar25 = 1;
          iVar10 = 1;
          if (uVar20 != 0) {
            piVar31 = *(int **)(local_198.Ptr + lVar19 + -0x30);
            iVar10 = *piVar31;
            iVar25 = piVar31[1];
            iVar27 = piVar31[2];
          }
          lVar36 = *(long *)((Subbands->Buffer).Data + lVar16 * 0x40 + 0x10);
          local_1f0 = (int)(lVar36 * 2 >> 0x2b) * iVar27;
          local_1f8._4_4_ = (int)((lVar36 << 0x16) >> 0x2b) * iVar25;
          local_1f8._0_4_ = (int)((lVar36 << 0x2b) >> 0x2b) * iVar10;
          lVar36 = *(long *)(local_198.Ptr + lVar19);
          lVar5 = lVar16 * 0xc;
          *(anon_union_8_2_2df48d06_for_stref_0 *)(lVar36 + lVar5) = local_1f8;
          *(uint *)(lVar36 + 8 + lVar5) = local_1f0;
          pbVar4 = Array->Data;
          pbVar1 = pbVar4 + lVar5;
          pbVar1[0] = '\x01';
          pbVar1[1] = '\0';
          pbVar1[2] = '\0';
          pbVar1[3] = '\0';
          pbVar1[4] = '\x01';
          pbVar1[5] = '\0';
          pbVar1[6] = '\0';
          pbVar1[7] = '\0';
          pbVar4 = pbVar4 + lVar5 + 8;
          pbVar4[0] = '\x01';
          pbVar4[1] = '\0';
          pbVar4[2] = '\0';
          pbVar4[3] = '\0';
          lVar36 = 0;
          do {
            iVar10 = *(int *)((long)&local_1e8 + lVar36 * 4);
            if (*(int *)((long)&local_148 + lVar36 * 4) % iVar10 == 0) {
              iVar25 = *(int *)((long)&local_1f8 + lVar36 * 4);
              if (iVar25 % iVar10 != 0) {
                *(int *)(Array->Data + lVar36 * 4 + lVar32) = iVar10 / iVar25;
              }
            }
            else {
              bVar26 = bVar26 & ~(byte)(1L << ((byte)lVar16 & 0x3f));
            }
            lVar36 = lVar36 + 1;
          } while (lVar36 != 3);
          lVar16 = lVar16 + 1;
          lVar32 = lVar32 + 0xc;
        } while (*(long *)(local_198.Ptr + lVar19 + 0x18) != lVar16);
      }
      uVar21 = uVar20 + 1;
      bVar15 = bVar26;
      if (bVar26 == 1) {
        bVar15 = 0;
      }
      if ((long)Idx2->NLevels <= (long)uVar21) {
        bVar15 = bVar26;
      }
      (Idx2->DecodeSubbandMasks).Arr[uVar20] = bVar15;
      uVar20 = uVar21;
    } while (uVar21 != (uint)(int)Idx2->NLevels);
  }
  aVar37 = local_198;
  if (auStack_180._0_8_ != 0) {
    do {
      (**(code **)(**(long **)(aVar37.Ptr + 0x28) + 8))(*(long **)(aVar37.Ptr + 0x28),aVar37.Ptr);
      *(undefined1 (*) [16])(aVar37.Ptr + 0x18) = (undefined1  [16])0x0;
      aVar37.Ptr = aVar37.Ptr + 0x30;
    } while (aVar37.Ptr != local_198.Ptr + auStack_180._0_8_ * 0x30);
  }
  (*paStack_170->_vptr_allocator[1])();
  auStack_180 = (undefined1  [16])0x0;
  if (auStack_e0._0_8_ != 0) {
    aVar37 = (anon_union_8_2_2df48d06_for_stref_0)local_f8._0_8_;
    do {
      (**(code **)(**(long **)(aVar37.Ptr + 0x28) + 8))(*(long **)(aVar37.Ptr + 0x28),aVar37.Ptr);
      *(undefined1 (*) [16])(aVar37.Ptr + 0x18) = (undefined1  [16])0x0;
      aVar37.Ptr = aVar37.Ptr + 0x30;
    } while (aVar37.Ptr != (str)(local_f8._0_8_ + auStack_e0._0_8_ * 0x30));
  }
  (*paStack_d0->_vptr_allocator[1])();
  lVar16 = *(long *)((Idx2->SubbandsNonExt).Buffer.Data + 8);
  iVar10 = (Idx2->BrickDims3).field_0.field_0.X;
  iVar25 = (Idx2->BrickDims3).field_0.field_0.Y;
  iVar34 = (Idx2->BrickDims3).field_0.field_0.Z;
  (Idx2->GroupBrick3).field_0.field_3.XY.field_0 =
       (anon_union_8_4_6ba14846_for_v2<int>_1)
       ((long)iVar25 / (long)(int)((lVar16 << 0x16) >> 0x2b) << 0x20 |
       (long)iVar10 / (long)(((int)lVar16 << 0xb) >> 0xb) & 0xffffffffU);
  (Idx2->GroupBrick3).field_0.field_0.Z = iVar34 / (int)(lVar16 * 2 >> 0x2b);
  if (Idx2->NLevels == '\0') {
    uVar20 = 0;
  }
  else {
    lVar19 = (long)((Idx2->Dims3).field_0.field_0.Z + iVar34 + -1) / (long)iVar34;
    lVar16 = (long)((Idx2->Dims3).field_0.field_0.Y + iVar25 + -1) / (long)iVar25;
    uVar21 = (long)(iVar10 + (Idx2->Dims3).field_0.field_0.X + -1) / (long)iVar10;
    piVar31 = &(Idx2->NBricks3).Arr[0].field_0.field_0.Z;
    uVar33 = 0;
    do {
      if (uVar33 == 0x10) goto LAB_0016f335;
      uVar20 = uVar21 & 0xffffffff | lVar16 << 0x20;
      ((anon_struct_12_3_4e9264bd_for_anon_union_12_8_3dedac88_for_v3<int>_1_0 *)(piVar31 + -2))->X
           = (int)uVar20;
      ((anon_struct_12_3_4e9264bd_for_anon_union_12_8_3dedac88_for_v3<int>_1_0 *)(piVar31 + -2))->Y
           = (int)(uVar20 >> 0x20);
      *piVar31 = (int)lVar19;
      iVar10 = (Idx2->GroupBrick3).field_0.field_0.X;
      iVar25 = (Idx2->GroupBrick3).field_0.field_0.Y;
      iVar34 = (Idx2->GroupBrick3).field_0.field_0.Z;
      uVar21 = (long)((int)uVar21 + -1 + iVar10) / (long)iVar10;
      lVar16 = (long)((int)lVar16 + iVar25 + -1) / (long)iVar25;
      lVar19 = (long)((int)lVar19 + iVar34 + -1) / (long)iVar34;
      uVar33 = uVar33 + 1;
      uVar20 = (ulong)Idx2->NLevels;
      piVar31 = piVar31 + 3;
    } while (uVar33 != (uVar20 & 0xffffffff));
  }
  local_48 = &Idx2->BricksOrderStr;
  Resize<idx2::stack_string<128>>(local_48,uVar20);
  if (Idx2->NLevels == '\0') {
    bVar42 = true;
  }
  else {
    local_200 = &Idx2->NBricks3;
    uVar20 = 0;
    do {
      if (uVar20 == 0x10) goto LAB_0016f335;
      uVar21 = *(ulong *)&local_200->Arr[uVar20].field_0;
      uVar33 = (ulong)(int)uVar21;
      lVar16 = 0x3f;
      if (uVar33 != 0) {
        for (; uVar33 >> lVar16 == 0; lVar16 = lVar16 + -1) {
        }
      }
      lVar19 = 0;
      bVar26 = -((uVar21 & 0xffffffff) == 0) | (byte)lVar16;
      uVar23 = (long)uVar21 >> 0x20;
      lVar16 = 0x3f;
      if (uVar23 != 0) {
        for (; uVar23 >> lVar16 == 0; lVar16 = lVar16 + -1) {
        }
      }
      bVar15 = -(uVar21 >> 0x20 == 0) | (byte)lVar16;
      uVar28 = (ulong)local_200->Arr[uVar20].field_0.field_0.Z;
      uVar35 = (uint)(char)((1L << (bVar26 & 0x3f) != uVar33) + bVar26);
      lVar16 = 0x3f;
      if (uVar28 != 0) {
        for (; uVar28 >> lVar16 == 0; lVar16 = lVar16 + -1) {
        }
      }
      bVar26 = -(uVar28 == 0) | (byte)lVar16;
      uVar17 = (uint)(char)((1L << (bVar15 & 0x3f) != uVar23) + bVar15);
      uVar18 = uVar17;
      if ((int)uVar35 < (int)uVar17) {
        uVar18 = uVar35;
      }
      uVar22 = (uint)(char)((1L << (bVar26 & 0x3f) != uVar28) + bVar26);
      if ((int)uVar22 <= (int)uVar18) {
        uVar18 = uVar22;
      }
      uVar24 = 0;
      if (1 < (Idx2->BrickDims3).field_0.field_0.X) {
        uVar24 = uVar18;
      }
      pcVar29 = (str)0x0;
      if (1 < (Idx2->BrickDims3).field_0.field_0.Y) {
        pcVar29 = (str)(ulong)uVar18;
      }
      if ((Idx2->BrickDims3).field_0.field_0.Z < 2) {
        uVar18 = 0;
      }
      local_1e8 = CONCAT44(uVar17 - (int)pcVar29,uVar35 - uVar24);
      uStack_1e0 = CONCAT44(uStack_1e0._4_4_,uVar22 - uVar18);
      uVar33 = 0;
      do {
        if ((Idx2->BrickDims3).field_0.E[lVar19] == 1) {
          iVar10 = *(int *)((long)&local_1e8 + lVar19 * 4);
          if ((long)iVar10 < 1) {
            iVar10 = iVar10 + -1;
          }
          else {
            memset(local_f8 + (int)uVar33,(int)lVar19 + 0x58,(long)iVar10);
            uVar33 = (ulong)(uint)((int)uVar33 + iVar10);
            iVar10 = -1;
          }
          *(int *)((long)&local_1e8 + lVar19 * 4) = iVar10;
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != 3);
      if (((0 < (int)local_1e8) || (0 < local_1e8._4_4_)) || (0 < (int)uStack_1e0)) {
        lVar16 = 0;
        do {
          do {
            do {
              do {
                iVar10 = *(int *)((long)&local_1e8 + lVar16 * 4);
                *(int *)((long)&local_1e8 + lVar16 * 4) = iVar10 + -1;
                if (0 < iVar10) {
                  iVar10 = (int)uVar33;
                  uVar33 = (ulong)(iVar10 + 1);
                  local_f8[iVar10] = (byte)lVar16 | 0x58;
                }
                lVar16 = lVar16 + 1;
              } while (lVar16 != 3);
              lVar16 = 0;
            } while (0 < (int)local_1e8);
            lVar16 = 0;
          } while (0 < local_1e8._4_4_);
          lVar16 = 0;
        } while (0 < (int)uStack_1e0);
      }
      iVar10 = (int)uVar33;
      if (0 < iVar10) {
        iVar10 = iVar10 + 1;
        local_f8[uVar33] = 0x2b;
      }
      *(undefined8 *)(local_f8 + iVar10) = local_208;
      local_198.Ptr = local_f8;
      sVar12 = strlen(local_f8);
      uStack_190 = (int)sVar12;
      this = (idx2 *)EncodeTransformOrder((stref *)&local_198);
      (Idx2->BricksOrder).Arr[uVar20] = (unsigned_long)this;
      N3.field_0._8_4_ = SUB84((Idx2->BricksOrderStr).Buffer.Data + uVar20 * 0x81,0);
      N3.field_0.field_3.XY.field_0 = (v2<int>)(v2<int>)uVar28;
      bVar26 = DecodeTransformOrder(this,uVar21,N3,pcVar29);
      (Idx2->BricksOrderStr).Buffer.Data[uVar20 * 0x81 + 0x80] = bVar26;
      if (bVar26 < (Idx2->TransformOrderFull).Len) {
        lVar16 = *in_FS_OFFSET;
        *(char **)(lVar16 + -0xb80) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
        ;
        *(undefined8 *)(*in_FS_OFFSET + -0x980) = 0x2ea00000205;
        *(char **)(lVar16 + -0xb78) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
        ;
        uVar35 = 0x117;
        pcVar40 = "";
        goto LAB_0016dfda;
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != (uint)(int)Idx2->NLevels);
    bVar42 = Idx2->NLevels == '\0';
  }
  puVar39 = (undefined8 *)(*in_FS_OFFSET + -0xb80);
  *puVar39 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
  ;
  puVar38 = (undefined4 *)(*in_FS_OFFSET + -0x980);
  *puVar38 = 0x208;
  iVar10 = Idx2->BricksPerChunkIn;
  iVar25 = Idx2->ChunksPerFileIn;
  (Idx2->BricksPerChunk).Arr[0] = iVar10;
  (Idx2->ChunksPerFile).Arr[0] = iVar25;
  if (iVar10 < 0x8001) {
    if (POPCOUNT(iVar10) == 1) {
      if (iVar25 < 0x132b) {
        bVar43 = POPCOUNT(iVar25) != 1;
        uVar11 = 0x26e;
        if (bVar43) {
          uVar11 = 0x219;
        }
        P_00 = (params *)0x21;
        if (!bVar43) {
          P_00 = (params *)0x0;
        }
        if (!bVar43 && !bVar42) {
          local_200 = &Idx2->BricksPerChunk3s;
          local_50 = &Idx2->NBricks3;
          local_58 = &Idx2->ChunksPerFile3s;
          local_60 = &Idx2->ChunksOrderStr;
          local_68 = &Idx2->FilesOrderStr;
          uVar20 = 0;
          local_78 = puVar38;
          local_70 = puVar39;
          do {
            paStack_d0 = (allocator *)0x0;
            uStack_c8 = 0;
            uStack_c0 = 0;
            local_f8._0_16_ = ZEXT816(0);
            local_f8._16_8_ = (allocator *)0x0;
            auStack_e0 = ZEXT816(0);
            local_b8 = 0;
            local_158 = 0;
            paStack_170 = (allocator *)0x0;
            uStack_168 = 0;
            uStack_160 = 0;
            _local_198 = (stref)ZEXT816(0);
            paStack_188 = (allocator *)0x0;
            auStack_180 = ZEXT816(0);
            local_1a8 = 0;
            local_1c8 = 0;
            uStack_1c0 = 0;
            uStack_1b8 = 0;
            uStack_1b0 = 0;
            local_1e8 = 0;
            uStack_1e0 = 0;
            uStack_1d8 = 0;
            uStack_1d0 = 0;
            if (uVar20 == 0x10) {
              pcVar40 = "t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]";
              goto LAB_0016f361;
            }
            lVar19 = uVar20 * 0x81;
            pbVar1 = (local_48->Buffer).Data;
            uVar21 = (ulong)(Idx2->BricksPerChunk).Arr[0];
            lVar16 = 0x3f;
            if (uVar21 != 0) {
              for (; uVar21 >> lVar16 == 0; lVar16 = lVar16 + -1) {
              }
            }
            uVar35 = 0;
            bVar26 = -(uVar21 == 0) | (byte)lVar16;
            bVar26 = (1L << (bVar26 & 0x3f) != uVar21) + bVar26;
            if (pbVar1[lVar19 + 0x80] < bVar26) {
              bVar26 = pbVar1[lVar19 + 0x80];
            }
            iVar10 = 1 << (bVar26 & 0x1f);
            (Idx2->BricksPerChunk).Arr[uVar20] = iVar10;
            uVar21 = (ulong)iVar10;
            lVar16 = 0x3f;
            if (uVar21 != 0) {
              for (; uVar21 >> lVar16 == 0; lVar16 = lVar16 + -1) {
              }
            }
            uVar18 = 0;
            local_b8 = (1L << ((byte)lVar16 & 0x3f) != uVar21) + (byte)lVar16;
            pvVar2 = local_200->Arr + uVar20;
            (pvVar2->field_0).field_3.XY.field_0 =
                 (anon_union_8_4_6ba14846_for_v2<int>_1)0x100000001;
            (pvVar2->field_0).field_0.Z = 1;
            if (local_b8 != 0) {
              uVar17 = (uint)local_b8;
              uVar18 = 0;
              iVar10 = -1;
              do {
                if (0x7f < (int)((uint)pbVar1[lVar19 + 0x80] + iVar10)) goto LAB_0016f2f1;
                bVar9 = pbVar1[(int)((uint)pbVar1[lVar19 + 0x80] + iVar10) + lVar19];
                if (0x5a < (long)(char)bVar9) goto LAB_0016f313;
                piVar31 = (int *)((long)pvVar2 + ((long)(char)bVar9 + -0x58) * 4);
                *piVar31 = *piVar31 << 1;
                if (0x3f < (int)(uVar17 + iVar10)) goto LAB_0016f2da;
                local_f8[(int)(uVar17 + iVar10)] = bVar9;
                uVar18 = uVar18 + 1;
                uVar17 = (uint)local_b8;
                iVar10 = iVar10 + -1;
              } while (uVar18 != uVar17);
            }
            local_148.Ptr = local_f8;
            uStack_140 = CONCAT44(uStack_140._4_4_,uVar18);
            uVar13 = EncodeTransformOrder((stref *)&local_148);
            (Idx2->BricksOrderInChunk).Arr[uVar20] = uVar13;
            iVar10 = (pvVar2->field_0).field_0.X;
            iVar25 = (pvVar2->field_0).field_0.Y;
            iVar34 = local_50->Arr[uVar20].field_0.field_0.Z;
            iVar27 = (pvVar2->field_0).field_0.Z;
            (Idx2->NChunks3).Arr[uVar20].field_0.field_3.XY.field_0 =
                 (anon_union_8_4_6ba14846_for_v2<int>_1)
                 ((long)(local_50->Arr[uVar20].field_0.field_0.Y + iVar25 + -1) / (long)iVar25 <<
                  0x20 | (long)(local_50->Arr[uVar20].field_0.field_0.X + -1 + iVar10) /
                         (long)iVar10 & 0xffffffffU);
            (Idx2->NChunks3).Arr[uVar20].field_0.field_0.Z = (iVar34 + iVar27 + -1) / iVar27;
            uVar21 = (ulong)(Idx2->ChunksPerFile).Arr[0];
            lVar16 = 0x3f;
            if (uVar21 != 0) {
              for (; uVar21 >> lVar16 == 0; lVar16 = lVar16 + -1) {
              }
            }
            bVar26 = -(uVar21 == 0) | (byte)lVar16;
            bVar26 = (1L << (bVar26 & 0x3f) != uVar21) + bVar26;
            pbVar1 = (Idx2->BricksOrderStr).Buffer.Data;
            if ((byte)(pbVar1[lVar19 + 0x80] - local_b8) < bVar26) {
              bVar26 = pbVar1[lVar19 + 0x80] - local_b8;
            }
            iVar10 = 1 << (bVar26 & 0x1f);
            uVar21 = (ulong)iVar10;
            lVar16 = 0x3f;
            if (uVar21 != 0) {
              for (; uVar21 >> lVar16 == 0; lVar16 = lVar16 + -1) {
              }
            }
            (Idx2->ChunksPerFile).Arr[uVar20] = iVar10;
            pvVar2 = local_58->Arr + uVar20;
            local_158 = (1L << ((byte)lVar16 & 0x3f) != uVar21) + (byte)lVar16;
            local_58->Arr[uVar20].field_0.field_3.XY.field_0 =
                 (anon_union_8_4_6ba14846_for_v2<int>_1)0x100000001;
            local_58->Arr[uVar20].field_0.field_0.Z = 1;
            if (local_158 != 0) {
              uVar18 = (uint)local_158;
              uVar17 = (uint)local_b8;
              uVar35 = 0;
              iVar10 = -1;
              do {
                iVar25 = (pbVar1[lVar19 + 0x80] - uVar17) + iVar10;
                if (0x7f < iVar25) goto LAB_0016f2f1;
                bVar9 = pbVar1[iVar25 + lVar19];
                if (0x5a < (long)(char)bVar9) {
LAB_0016f313:
                  __assert_fail("Idx < 3",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                                ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
                }
                piVar31 = (int *)((long)pvVar2 + ((long)(char)bVar9 + -0x58) * 4);
                *piVar31 = *piVar31 << 1;
                if (0x3f < (int)(uVar18 + iVar10)) goto LAB_0016f2da;
                *(byte *)((long)&local_198 + (long)(int)(uVar18 + iVar10)) = bVar9;
                uVar35 = uVar35 + 1;
                uVar18 = (uint)local_158;
                iVar10 = iVar10 + -1;
              } while (uVar35 != uVar18);
            }
            paVar41 = &(Idx2->NChunks3).Arr[uVar20].field_0;
            local_148.Ptr = (str)&local_198;
            uStack_140 = CONCAT44(uStack_140._4_4_,uVar35);
            uVar13 = EncodeTransformOrder((stref *)&local_148);
            (Idx2->ChunksOrderInFile).Arr[uVar20] = uVar13;
            iVar10 = (pvVar2->field_0).field_0.X;
            uVar35 = (pvVar2->field_0).field_0.Y;
            pcVar29 = (str)(ulong)uVar35;
            iVar25 = *(int *)((long)paVar41 + 8);
            iVar34 = (pvVar2->field_0).field_0.Z;
            (Idx2->NFiles3).Arr[uVar20].field_0.field_3.XY.field_0 =
                 (anon_union_8_4_6ba14846_for_v2<int>_1)
                 ((long)(int)((paVar41->field_0).Y + uVar35 + -1) / (long)(int)uVar35 << 0x20 |
                 (long)((paVar41->field_0).X + -1 + iVar10) / (long)iVar10 & 0xffffffffU);
            (Idx2->NFiles3).Arr[uVar20].field_0.field_0.Z = (iVar25 + iVar34 + -1) / iVar34;
            local_128 = 0;
            uStack_120 = 0;
            uStack_118 = 0;
            uStack_110 = 0;
            local_148.Ptr = (str)0x0;
            uStack_140 = 0;
            uStack_138 = 0;
            uStack_130 = 0;
            pbVar1 = (Idx2->BricksOrderStr).Buffer.Data;
            uVar35 = (uint)local_b8;
            uVar21 = (ulong)(1 << (pbVar1[lVar19 + 0x80] - local_b8 & 0x1f));
            lVar16 = 0x3f;
            if (uVar21 != 0) {
              for (; uVar21 >> lVar16 == 0; lVar16 = lVar16 + -1) {
              }
            }
            uVar18 = 0;
            uVar17 = 0;
            local_108 = (1L << ((byte)lVar16 & 0x3f) != uVar21) + (byte)lVar16;
            if (local_108 != 0) {
              uVar22 = (uint)local_108;
              uVar17 = 0;
              iVar10 = -1;
              do {
                iVar25 = (pbVar1[lVar19 + 0x80] - uVar35) + iVar10;
                if (0x7f < iVar25) goto LAB_0016f2f1;
                if (0x3f < (int)(uVar22 + iVar10)) goto LAB_0016f2da;
                pcVar29 = (str)CONCAT71((int7)(int3)((uint)iVar25 >> 8),pbVar1[iVar25 + lVar19]);
                *(byte *)((long)&local_148 + (long)(int)(uVar22 + iVar10)) = pbVar1[iVar25 + lVar19]
                ;
                uVar17 = uVar17 + 1;
                uVar22 = (uint)local_108;
                iVar10 = iVar10 + -1;
              } while (uVar17 != uVar22);
            }
            local_1f8.Ptr = (str)&local_148;
            local_1f0 = uVar17;
            uVar13 = EncodeTransformOrder((stref *)&local_1f8);
            (Idx2->ChunksOrder).Arr[uVar20] = uVar13;
            Resize<idx2::stack_string<128>>(local_60,(long)Idx2->NLevels);
            N3_00.field_0.field_0.Y = 0;
            N3_00.field_0.field_0.X = *(uint *)((long)paVar41 + 8);
            N3_00.field_0._8_4_ = SUB84((Idx2->ChunksOrderStr).Buffer.Data + lVar19,0);
            bVar9 = DecodeTransformOrder
                              ((idx2 *)(Idx2->ChunksOrder).Arr[uVar20],
                               (u64)(paVar41->field_3).XY.field_0,N3_00,pcVar29);
            (Idx2->ChunksOrderStr).Buffer.Data[lVar19 + 0x80] = bVar9;
            pbVar1 = (Idx2->BricksOrderStr).Buffer.Data;
            uVar35 = (uint)local_158;
            uVar17 = (uint)local_b8;
            uVar21 = (ulong)(1 << (pbVar1[lVar19 + 0x80] - (char)(uVar35 + uVar17) & 0x1f));
            lVar16 = 0x3f;
            if (uVar21 != 0) {
              for (; uVar21 >> lVar16 == 0; lVar16 = lVar16 + -1) {
              }
            }
            local_1a8 = (1L << ((byte)lVar16 & 0x3f) != uVar21) + (byte)lVar16;
            if (local_1a8 != 0) {
              uVar22 = (uint)local_1a8;
              uVar18 = 0;
              iVar10 = -1;
              do {
                iVar25 = ((uint)pbVar1[lVar19 + 0x80] - (uVar35 + uVar17)) + iVar10;
                if (0x7f < iVar25) goto LAB_0016f2f1;
                if (0x3f < (int)(uVar22 + iVar10)) goto LAB_0016f2da;
                *(byte *)((long)&local_1e8 + (long)(int)(uVar22 + iVar10)) = pbVar1[iVar25 + lVar19]
                ;
                uVar18 = uVar18 + 1;
                uVar22 = (uint)local_1a8;
                iVar10 = iVar10 + -1;
              } while (uVar18 != uVar22);
            }
            paVar41 = &(Idx2->NFiles3).Arr[uVar20].field_0;
            local_148.Ptr = (str)&local_1e8;
            uStack_140 = CONCAT44(uStack_140._4_4_,uVar18);
            uVar13 = EncodeTransformOrder((stref *)&local_148);
            (Idx2->FilesOrder).Arr[uVar20] = uVar13;
            Resize<idx2::stack_string<128>>(local_68,(long)Idx2->NLevels);
            N3_01.field_0.field_0.Y = 0;
            N3_01.field_0.field_0.X = *(uint *)((long)paVar41 + 8);
            N3_01.field_0._8_4_ = SUB84((Idx2->FilesOrderStr).Buffer.Data + lVar19,0);
            bVar9 = DecodeTransformOrder
                              ((idx2 *)(Idx2->FilesOrder).Arr[uVar20],
                               (u64)(paVar41->field_3).XY.field_0,N3_01,pcVar29);
            (Idx2->FilesOrderStr).Buffer.Data[lVar19 + 0x80] = bVar9;
            uVar20 = uVar20 + 1;
            P_00 = (params *)0x0;
          } while (uVar20 != (uint)(int)Idx2->NLevels);
          uVar11 = 0x26e;
          puVar38 = local_78;
          puVar39 = local_70;
        }
      }
      else {
        P_00 = (params *)0x20;
        uVar11 = 0x217;
      }
    }
    else {
      P_00 = (params *)0x22;
      uVar11 = 0x215;
    }
  }
  else {
    P_00 = (params *)0x1f;
    uVar11 = 0x213;
  }
  *puVar39 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
  ;
  *puVar38 = uVar11;
  local_40 = "";
  local_38 = SUB82(P_00,0);
  local_36 = 0;
  if ((char)P_00 == '\0') {
    eVar49 = ComputeFileDirDepths(Idx2,P_00);
    local_f8._0_11_ = eVar49._0_11_;
    if (eVar49.Code == NoError) {
      ComputeWaveletTransformDetails(Idx2);
      *puVar39 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
      ;
      *puVar38 = 0x2f1;
      pcVar40 = "";
      uVar35 = 0;
      goto LAB_0016dfda;
    }
    local_198.Ptr = local_f8;
    eVar49 = Finalize::anon_class_8_1_32d6a57b::operator()((anon_class_8_1_32d6a57b *)&local_198);
    auVar6 = eVar49._0_12_;
  }
  else {
    local_f8._0_8_ = &local_40;
    eVar49 = Finalize::anon_class_8_1_32d6a57b::operator()((anon_class_8_1_32d6a57b *)local_f8);
    auVar6 = eVar49._0_12_;
  }
  pcVar40 = auVar6._0_8_;
  uVar35 = auVar6._8_4_;
LAB_0016dfda:
  uVar35 = uVar35 & 0xffffff;
  eVar49.Code = (char)uVar35;
  eVar49.StackIdx = (char)(uVar35 >> 8);
  eVar49.StrGened = (bool)(char)(uVar35 >> 0x10);
  eVar49._11_1_ = (char)(uVar35 >> 0x18);
  eVar49.Msg = pcVar40;
  eVar49._12_4_ = 0;
  return eVar49;
LAB_0016f2f1:
  pcVar40 = "char &idx2::stack_string<128>::operator[](int) const [N = 128]";
  goto LAB_0016f306;
LAB_0016f335:
  pcVar40 = 
  "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]";
LAB_0016f361:
  __assert_fail("Idx < N",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x20c,pcVar40);
LAB_0016f2da:
  pcVar40 = "char &idx2::stack_string<64>::operator[](int) const [N = 64]";
LAB_0016f306:
  __assert_fail("Idx < N",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x237,pcVar40);
}

Assistant:

error<idx2_err_code>
Finalize(idx2_file* Idx2, params* P)
{
  idx2_PropagateIfError(CheckBrickSize(Idx2, *P));
  P->Tolerance = Max(fabs(P->Tolerance), Idx2->Tolerance);
  //printf("tolerance = %.16f\n", P->Tolerance);
  GuessNumLevelsIfNeeded(Idx2);
  if (!(Idx2->NLevels <= idx2_file::MaxLevels))
    return idx2_Error(idx2_err_code::TooManyLevels, "Max # of levels = %d\n", Idx2->MaxLevels);
  if ((Idx2->BitPlanesPerChunk > Idx2->BitPlanesPerFile) ||
      (Idx2->BitPlanesPerFile % Idx2->BitPlanesPerChunk) != 0)
    return idx2_Error(idx2_err_code::SizeMismatched, "BitPlanesPerFile not multiple of BitPlanesPerChunk\n");


  char TformOrder[8] = {};
  ComputeTransformOrder(Idx2, *P, TformOrder);

  BuildSubbands(Idx2, *P);

  ComputeNumBricksPerLevel(Idx2, *P);

  idx2_PropagateIfError(ComputeGlobalBricksOrder(Idx2, *P, TformOrder));
  idx2_PropagateIfError(ComputeLocalBricksChunksFilesOrders(Idx2, *P));

  idx2_PropagateIfError(ComputeFileDirDepths(Idx2, *P));

  ComputeWaveletTransformDetails(Idx2);

  return idx2_Error(idx2_err_code::NoError);
}